

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

void internal_refresh(EPSG *psg)

{
  uint local_14;
  uint32_t clk;
  EPSG *psg_local;
  
  local_14 = psg->clk;
  if ((psg->chp_flags & 0x10) != 0) {
    local_14 = local_14 >> 1;
  }
  if (psg->quality == 0) {
    psg->base_incr = (uint32_t)(long)(((double)local_14 * 16777216.0) / ((double)psg->rate * 8.0));
  }
  else {
    psg->base_incr = 0x1000000;
    psg->realstep = (uint32_t)(0x80000000 / (ulong)psg->rate);
    psg->psgstep = (uint32_t)(0x80000000 / (ulong)(local_14 >> 3));
    psg->psgtime = 0;
  }
  return;
}

Assistant:

static void
internal_refresh (EPSG * psg)
{
  uint32_t clk = psg->clk;
  
  if (psg->chp_flags & YM2149_PIN26_LOW)
    clk /= 2;
  
  if (psg->quality)
  {
    psg->base_incr = 1 << GETA_BITS;
    psg->realstep = (uint32_t) ((1 << 31) / psg->rate);
    psg->psgstep = (uint32_t) ((1 << 31) / (clk / 8));
    psg->psgtime = 0;
  }
  else
  {
    psg->base_incr =
      (uint32_t) ((double) clk * (1 << GETA_BITS) / (8.0 * psg->rate));
  }
}